

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ClosePopupToLevel(int remaining,bool restore_focus_to_window_under_popup)

{
  int *piVar1;
  ImGuiPopupData *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiPopupData *__dest;
  ImGuiWindow *pIVar4;
  ImGuiWindow *pIVar5;
  int iVar6;
  
  pIVar3 = GImGui;
  if ((GImGui->DebugLogFlags & 4) != 0) {
    DebugLog("[popup] ClosePopupToLevel(%d), restore_focus_to_window_under_popup=%d\n",
             (ulong)(uint)remaining,restore_focus_to_window_under_popup);
  }
  pIVar2 = (pIVar3->OpenPopupStack).Data;
  pIVar5 = pIVar2[remaining].Window;
  pIVar4 = pIVar2[remaining].BackupNavWindow;
  iVar6 = (pIVar3->OpenPopupStack).Capacity;
  if (iVar6 < remaining) {
    if (iVar6 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar6 / 2 + iVar6;
    }
    if (iVar6 <= remaining) {
      iVar6 = remaining;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (ImGuiPopupData *)(*GImAllocatorAllocFunc)((long)iVar6 * 0x38,GImAllocatorUserData);
    pIVar2 = (pIVar3->OpenPopupStack).Data;
    if (pIVar2 != (ImGuiPopupData *)0x0) {
      memcpy(__dest,pIVar2,(long)(pIVar3->OpenPopupStack).Size * 0x38);
      pIVar2 = (pIVar3->OpenPopupStack).Data;
      if ((pIVar2 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
    }
    (pIVar3->OpenPopupStack).Data = __dest;
    (pIVar3->OpenPopupStack).Capacity = iVar6;
  }
  (pIVar3->OpenPopupStack).Size = remaining;
  if (!restore_focus_to_window_under_popup) {
    return;
  }
  if ((pIVar5 != (ImGuiWindow *)0x0) && ((pIVar5->Flags & 0x10000000) != 0)) {
    pIVar4 = pIVar5->ParentWindow;
  }
  if (pIVar4 == (ImGuiWindow *)0x0) {
    pIVar5 = (ImGuiWindow *)0x0;
  }
  else {
    if ((pIVar5 != (ImGuiWindow *)0x0) && (pIVar4->WasActive == false)) {
      FocusTopMostWindowUnderOne(pIVar5,(ImGuiWindow *)0x0);
      return;
    }
    if (((pIVar3->NavLayer != ImGuiNavLayer_Main) ||
        (pIVar5 = pIVar4->NavLastChildNavWindow, pIVar5 == (ImGuiWindow *)0x0)) ||
       (pIVar5->WasActive == false)) {
      pIVar5 = pIVar4;
    }
  }
  FocusWindow(pIVar5);
  return;
}

Assistant:

void ImGui::ClosePopupToLevel(int remaining, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    IMGUI_DEBUG_LOG_POPUP("[popup] ClosePopupToLevel(%d), restore_focus_to_window_under_popup=%d\n", remaining, restore_focus_to_window_under_popup);
    IM_ASSERT(remaining >= 0 && remaining < g.OpenPopupStack.Size);

    // Trim open popup stack
    ImGuiWindow* popup_window = g.OpenPopupStack[remaining].Window;
    ImGuiWindow* popup_backup_nav_window = g.OpenPopupStack[remaining].BackupNavWindow;
    g.OpenPopupStack.resize(remaining);

    if (restore_focus_to_window_under_popup)
    {
        ImGuiWindow* focus_window = (popup_window && popup_window->Flags & ImGuiWindowFlags_ChildMenu) ? popup_window->ParentWindow : popup_backup_nav_window;
        if (focus_window && !focus_window->WasActive && popup_window)
        {
            // Fallback
            FocusTopMostWindowUnderOne(popup_window, NULL);
        }
        else
        {
            if (g.NavLayer == ImGuiNavLayer_Main && focus_window)
                focus_window = NavRestoreLastChildNavWindow(focus_window);
            FocusWindow(focus_window);
        }
    }
}